

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

int __thiscall cvm::BasicValue::toInt(BasicValue *this)

{
  int iVar1;
  char *__nptr;
  char *in_RAX;
  int *piVar2;
  ulong uVar3;
  undefined8 uVar4;
  char *local_28;
  
  switch(this->Type) {
  case BoolType:
    uVar3 = (ulong)(this->field_2).BoolVal;
    break;
  case IntType:
    uVar3 = (ulong)(uint)(this->field_2).IntVal;
    break;
  case DoubleType:
    uVar3 = (ulong)(uint)(int)(this->field_2).DoubleVal;
    break;
  case StringType:
    __nptr = (this->StrVal)._M_dataplus._M_p;
    local_28 = in_RAX;
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    *piVar2 = 0;
    uVar3 = strtol(__nptr,&local_28,10);
    if (local_28 == __nptr) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((long)(int)uVar3 == uVar3) && (*piVar2 != 0x22)) {
      if (*piVar2 == 0) {
        *piVar2 = iVar1;
      }
      break;
    }
    uVar4 = std::__throw_out_of_range("stoi");
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    _Unwind_Resume(uVar4);
  default:
    uVar3 = 0;
  }
  return (int)uVar3;
}

Assistant:

int BasicValue::toInt() const {
  switch (Type) {
  default:          return 0;
  case IntType:     return IntVal;
  case DoubleType:  return static_cast<int>(DoubleVal);
  case BoolType:    return BoolVal;
  case StringType:  return std::stoi(StrVal);
  }
}